

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS
ref_clump_zone_around
          (FILE *f,REF_CELL ref_cell,REF_DICT ref_dict,char *zonetype,REF_DICT node_dict,
          REF_NODE ref_node,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_DICT ref_dict_00;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  REF_INT local;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_DBL m [6];
  REF_DBL jacob [9];
  REF_INT nodes [27];
  int local_18c;
  FILE *local_188;
  REF_DICT local_180;
  REF_CELL local_178;
  REF_DICT local_170;
  double local_168;
  double local_160;
  double local_158;
  REF_DBL local_148;
  undefined8 local_140;
  undefined8 local_138;
  REF_DBL local_128 [6];
  REF_DBL local_f8 [10];
  REF_INT local_a8 [30];
  
  if (ref_dict->n < 1) {
    uVar2 = 0;
  }
  else {
    local_188 = (FILE *)f;
    local_178 = ref_cell;
    uVar2 = ref_node_metric_get(ref_node,node,local_128);
    if (uVar2 == 0) {
      uVar2 = ref_matrix_jacob_m(local_128,local_f8);
      if (uVar2 == 0) {
        uVar2 = 0;
        local_170 = ref_dict;
        fprintf(local_188,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                zonetype,(ulong)(uint)node_dict->n,(ulong)(uint)ref_dict->n,"point",zonetype);
        local_180 = node_dict;
        if (0 < node_dict->n) {
          lVar7 = (long)(node * 0xf);
          lVar6 = 0;
          do {
            local_18c = local_180->key[lVar6];
            lVar4 = (long)local_18c;
            pRVar1 = ref_node->real;
            local_168 = pRVar1[lVar4 * 0xf] - pRVar1[lVar7];
            local_160 = pRVar1[lVar4 * 0xf + 1] - pRVar1[lVar7 + 1];
            local_158 = pRVar1[lVar4 * 0xf + 2] - pRVar1[lVar7 + 2];
            uVar3 = ref_matrix_vect_mult(local_f8,&local_168,&local_148);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x3b,"ref_clump_zone_around",(ulong)uVar3,"ax");
              return uVar3;
            }
            lVar5 = (long)local_18c;
            lVar4 = -1;
            if (((-1 < lVar5) && (local_18c < ref_node->max)) &&
               (lVar4 = ref_node->global[lVar5], lVar4 < 0)) {
              lVar4 = -1;
            }
            pRVar1 = ref_node->real;
            fprintf(local_188," %.16e %.16e %.16e %.16e %.16e %.16e %ld\n",pRVar1[lVar5 * 0xf],
                    pRVar1[lVar5 * 0xf + 1],pRVar1[lVar5 * 0xf + 2],local_148,local_140,local_138,
                    lVar4);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_180->n);
        }
        ref_dict_00 = local_180;
        if (0 < local_170->n) {
          lVar6 = 0;
          do {
            uVar2 = ref_cell_nodes(local_178,local_170->key[lVar6],local_a8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x44,"ref_clump_zone_around",(ulong)uVar2,"n");
              return uVar2;
            }
            if (0 < local_178->node_per) {
              lVar7 = 0;
              do {
                uVar2 = ref_dict_location(ref_dict_00,local_a8[lVar7],&local_18c);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0x46,"ref_clump_zone_around",(ulong)uVar2,"ret");
                  return uVar2;
                }
                fprintf(local_188," %d",(ulong)(local_18c + 1));
                lVar7 = lVar7 + 1;
              } while (lVar7 < local_178->node_per);
            }
            fputc(10,local_188);
            lVar6 = lVar6 + 1;
            uVar2 = 0;
          } while (lVar6 < local_170->n);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x2d,"ref_clump_zone_around",(ulong)uVar2,"jac");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x2c,
             "ref_clump_zone_around",(ulong)uVar2,"get");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_clump_zone_around(
    FILE *f, REF_CELL ref_cell, REF_DICT ref_dict, const char *zonetype,
    REF_DICT node_dict, REF_NODE ref_node, REF_INT node) {
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_INT local;
  REF_DBL m[6], jacob[9];

  if (ref_dict_n(ref_dict) <= 0) return REF_SUCCESS;

  RSS(ref_node_metric_get(ref_node, node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");

  fprintf(
      f, "zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      zonetype, ref_dict_n(node_dict), ref_dict_n(ref_dict), "point", zonetype);

  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] =
        ref_node_xyz(ref_node, 0, local) - ref_node_xyz(ref_node, 0, node);
    xyz_phys[1] =
        ref_node_xyz(ref_node, 1, local) - ref_node_xyz(ref_node, 1, node);
    xyz_phys[2] =
        ref_node_xyz(ref_node, 2, local) - ref_node_xyz(ref_node, 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e %.16e %.16e %.16e " REF_GLOB_FMT "\n",
            ref_node_xyz(ref_node, 0, local), ref_node_xyz(ref_node, 1, local),
            ref_node_xyz(ref_node, 2, local), xyz_comp[0], xyz_comp[1],
            xyz_comp[2], ref_node_global(ref_node, local));
  }

  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    fprintf(f, "\n");
  }

  return REF_SUCCESS;
}